

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.h
# Opt level: O0

void __thiscall slang::ast::TypeArgFormatter::~TypeArgFormatter(TypeArgFormatter *this)

{
  TypeArgFormatter *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~TypeArgFormatter(in_RDI);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

class SLANG_EXPORT TypeArgFormatter : public DiagArgFormatter {
public:
    /// Constructs a new type arg formatter.
    TypeArgFormatter();

    /// Set the options to use when formatting types.
    void setOptions(const TypePrintingOptions& options) { printer.options = options; }

    void startMessage(const Diagnostic& diag) final;
    std::string format(const std::any& arg) final;

private:
    TypePrinter printer;
    flat_hash_set<const Type*> seenTypes;
    flat_hash_set<const Type*> typesToDisambiguate;
}